

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

string * toml::internal::unescape(string *__return_storage_ptr__,string *codepoint)

{
  byte bVar1;
  size_t sVar2;
  uint8_t buf [8];
  uint32_t x;
  stringstream ss;
  byte local_1a4 [8];
  uint local_19c;
  long local_198 [3];
  uint auStack_180 [26];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream
            ((stringstream *)local_198,(string *)codepoint,_S_out|_S_in);
  *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffffb5 | 8;
  std::istream::_M_extract<unsigned_int>((uint *)local_198);
  bVar1 = (byte)local_19c;
  if (local_19c < 0x80) {
    local_1a4[1] = 0;
    local_1a4[0] = bVar1;
  }
  else if (local_19c < 0x800) {
    local_1a4[0] = (byte)(local_19c >> 6) | 0xc0;
    local_1a4[1] = bVar1 & 0x3f | 0x80;
    local_1a4[2] = 0;
  }
  else if (local_19c < 0x10000) {
    local_1a4[0] = (byte)(local_19c >> 0xc) | 0xe0;
    local_1a4[1] = (byte)(local_19c >> 6) & 0x3f | 0x80;
    local_1a4[2] = bVar1 & 0x3f | 0x80;
    local_1a4[3] = 0;
  }
  else if (local_19c < 0x110000) {
    local_1a4[0] = (byte)(local_19c >> 0x12) | 0xf0;
    local_1a4[1] = (byte)(local_19c >> 0xc) & 0x3f | 0x80;
    local_1a4[2] = (byte)(local_19c >> 6) & 0x3f | 0x80;
    local_1a4[3] = bVar1 & 0x3f | 0x80;
    local_1a4[4] = 0;
  }
  else {
    local_1a4[0] = 0;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen((char *)local_1a4);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_1a4,local_1a4 + sVar2);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

inline std::string unescape(const std::string& codepoint)
{
    std::uint32_t x;
    std::uint8_t buf[8];
    std::stringstream ss(codepoint);

    ss >> std::hex >> x;

    if (x <= 0x7FUL) {
        // 0xxxxxxx
        buf[0] = 0x00 | ((x >> 0) & 0x7F);
        buf[1] = '\0';
    } else if (x <= 0x7FFUL) {
        // 110yyyyx 10xxxxxx
        buf[0] = 0xC0 | ((x >> 6) & 0xDF);
        buf[1] = 0x80 | ((x >> 0) & 0xBF);
        buf[2] = '\0';
    } else if (x <= 0xFFFFUL) {
        // 1110yyyy 10yxxxxx 10xxxxxx
        buf[0] = 0xE0 | ((x >> 12) & 0xEF);
        buf[1] = 0x80 | ((x >> 6) & 0xBF);
        buf[2] = 0x80 | ((x >> 0) & 0xBF);
        buf[3] = '\0';
    } else if (x <= 0x10FFFFUL) {
        // 11110yyy 10yyxxxx 10xxxxxx 10xxxxxx
        buf[0] = 0xF0 | ((x >> 18) & 0xF7);
        buf[1] = 0x80 | ((x >> 12) & 0xBF);
        buf[2] = 0x80 | ((x >> 6) & 0xBF);
        buf[3] = 0x80 | ((x >> 0) & 0xBF);
        buf[4] = '\0';
    } else {
        buf[0] = '\0';
    }

    return reinterpret_cast<char*>(buf);
}